

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O3

void Am_Delete_Word_Before_Cursor(Am_Object *text)

{
  bool bVar1;
  Am_Code_Flag AVar2;
  uint to;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  uint from;
  Am_String old_str;
  Am_String AStack_48;
  Am_Object local_40;
  Am_String local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  pAVar3 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    Am_Object::Am_Object(&local_28,text);
    Am_Delete_Entire_String(&local_28);
    Am_Object::~Am_Object(&local_28);
    return;
  }
  Am_Object::Am_Object(&local_30,text);
  AVar2 = ml_which_code(&local_30);
  Am_Object::~Am_Object(&local_30);
  if (AVar2 != Am_ONE_BYTE_CODE) {
    return;
  }
  pAVar3 = Am_Object::Get(text,0xad,0);
  to = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&AStack_48,pAVar3);
  pcVar4 = Am_String::operator_cast_to_char_(&AStack_48);
  sVar5 = strlen(pcVar4);
  if ((int)sVar5 < (int)to) goto LAB_001dd4ee;
  from = to;
  if (0 < (int)to) {
    do {
      pcVar4 = Am_String::operator_cast_to_char_(&AStack_48);
      if (pcVar4[(ulong)from - 1] != ' ') goto LAB_001dd464;
      bVar1 = 1 < (int)from;
      from = from - 1;
    } while (bVar1);
    goto LAB_001dd483;
  }
  goto LAB_001dd486;
  while (bVar1 = 1 < (int)from, from = from - 1, bVar1) {
LAB_001dd464:
    pcVar4 = Am_String::operator_cast_to_char_(&AStack_48);
    if (pcVar4[(ulong)from - 1] == ' ') goto LAB_001dd486;
  }
LAB_001dd483:
  from = 0;
LAB_001dd486:
  pcVar4 = Am_String::operator_cast_to_char_(&AStack_48);
  pcVar4 = Am_Delete_Substring(pcVar4,from,to);
  Am_String::Am_String(&local_38,pcVar4,false);
  Am_Object::Set(text,0xab,&local_38,0);
  Am_String::~Am_String(&local_38);
  Am_Object::Am_Object(&local_40,text);
  Am_Move_Cursor_Left(&local_40,to - from);
  Am_Object::~Am_Object(&local_40);
LAB_001dd4ee:
  Am_String::~Am_String(&AStack_48);
  return;
}

Assistant:

void
Am_Delete_Word_Before_Cursor(Am_Object text)
{
  if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
    Am_Delete_Entire_String(text);
  else if (ml_which_code(text) == Am_TWO_BYTE_CODE)
    ;
  // Space does not exist in two-byte code string.
  else { // Am_ONE_BYTE_CODE or Am_SHIFT_JIS_CODE
    int cursor_index = text.Get(Am_CURSOR_INDEX);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = strlen(old_str);
    if (cursor_index <= str_len) {
      char *new_str;
      int start_wrd = cursor_index;
      // if there are spaces before the cursor, delete them with the word
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] == ' ') {
        start_wrd--;
      }
      // delete back to but not including the next space
      while (start_wrd > 0 && ((const char *)old_str)[start_wrd - 1] != ' ') {
        start_wrd--;
      }
      // create a new string, since it changed in size.
      // +1 for the terminating /0
      new_str = Am_Delete_Substring(old_str, start_wrd, cursor_index);
      text.Set(Am_TEXT, Am_String(new_str, false));
      Am_Move_Cursor_Left(text, cursor_index - start_wrd);
    }
  }
}